

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

input_options * parse_source(vw *all,options_i *options)

{
  bool bVar1;
  byte bVar2;
  options_boost_po *this;
  option_group_definition *key;
  undefined8 uVar3;
  ostream *this_00;
  long *in_RDX;
  long in_RSI;
  input_options *in_RDI;
  stringstream __msg;
  string data;
  options_boost_po *boost_options;
  options_i *options_ptr;
  option_group_definition input_options;
  input_options *parsed_options;
  value_type *in_stack_ffffffffffffeba8;
  undefined6 in_stack_ffffffffffffebb0;
  undefined1 in_stack_ffffffffffffebb6;
  byte in_stack_ffffffffffffebb7;
  string *in_stack_ffffffffffffebb8;
  string *in_stack_ffffffffffffebc0;
  allocator *paVar4;
  undefined6 in_stack_ffffffffffffebc8;
  undefined1 in_stack_ffffffffffffebce;
  undefined1 in_stack_ffffffffffffebcf;
  parser *in_stack_ffffffffffffebd0;
  int iVar6;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffebd8;
  undefined7 in_stack_ffffffffffffebe0;
  undefined1 in_stack_ffffffffffffebe7;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffebf8;
  option_group_definition *in_stack_ffffffffffffec00;
  byte local_13f2;
  byte local_13ba;
  byte local_138a;
  long local_1378;
  string *token;
  allocator local_1161;
  string local_1160 [37];
  byte local_113b;
  byte local_113a;
  allocator local_1139;
  string local_1138 [39];
  undefined1 local_1111;
  stringstream local_10f0 [16];
  ostream local_10e0;
  byte local_f63;
  byte local_f62;
  allocator local_f61;
  string local_f60 [37];
  byte local_f3b;
  byte local_f3a;
  allocator local_f39;
  string local_f38 [39];
  allocator local_f11;
  string local_f10 [32];
  string local_ef0 [37];
  byte local_ecb;
  byte local_eca;
  allocator local_ec9;
  string local_ec8 [37];
  byte local_ea3;
  byte local_ea2;
  allocator local_ea1;
  string local_ea0 [39];
  allocator local_e79;
  string local_e78 [32];
  string local_e58 [32];
  long local_e38;
  long *local_e30;
  allocator local_e21;
  string local_e20 [39];
  allocator local_df9;
  string local_df8 [199];
  allocator local_d31;
  string local_d30 [39];
  allocator local_d09;
  string local_d08 [199];
  allocator local_c41;
  string local_c40 [39];
  allocator local_c19;
  string local_c18 [39];
  allocator local_bf1;
  string local_bf0 [199];
  allocator local_b29;
  string local_b28 [39];
  undefined1 local_b01 [200];
  allocator local_a39;
  string local_a38 [39];
  allocator local_a11;
  string local_a10 [199];
  allocator local_949;
  string local_948 [39];
  allocator local_921;
  string local_920 [199];
  allocator local_859;
  string local_858 [39];
  allocator local_831;
  string local_830 [39];
  allocator local_809;
  string local_808 [199];
  allocator local_741;
  string local_740 [39];
  allocator local_719;
  string local_718 [199];
  allocator local_651;
  string local_650 [39];
  allocator local_629;
  string local_628 [199];
  allocator local_561;
  string local_560 [39];
  allocator local_539;
  string local_538 [199];
  allocator local_471;
  string local_470 [39];
  allocator local_449;
  string local_448 [199];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [199];
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [199];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [215];
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [63];
  byte local_19;
  long *local_18;
  long local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ::input_options::input_options
            ((input_options *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Input options",&local_79);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
             in_stack_ffffffffffffeba8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"data",&local_151);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffebb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"d",&local_179);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  short_name((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffebb7,
                         CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
             in_stack_ffffffffffffeba8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"Example set",&local_1a1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)CONCAT17(in_stack_ffffffffffffebb7,
                   CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
       in_stack_ffffffffffffeba8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"daemon",&local_269);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffebb8,
             (bool *)CONCAT17(in_stack_ffffffffffffebb7,
                              CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"persistent daemon mode on port 26542",&local_291);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
             in_stack_ffffffffffffeba8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffec00,(typed_option<bool> *)in_stack_ffffffffffffebf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,"foreground",&local_359);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffebb8,
             (bool *)CONCAT17(in_stack_ffffffffffffebb7,
                              CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_380,"in persistent daemon mode, do not run in the background",&local_381);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
             in_stack_ffffffffffffeba8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffec00,(typed_option<bool> *)in_stack_ffffffffffffebf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"port",&local_449);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffebb8,
             (unsigned_long *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"port to listen on; use 0 to pick unused port",&local_471);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
             in_stack_ffffffffffffeba8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffec00,(typed_option<unsigned_long> *)in_stack_ffffffffffffebf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"num_children",&local_539);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffebb8,
             (unsigned_long *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"number of children for persistent daemon mode",&local_561)
  ;
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
             in_stack_ffffffffffffeba8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffec00,(typed_option<unsigned_long> *)in_stack_ffffffffffffebf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_628,"pid_file",&local_629);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffebb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_650,"Write pid file in persistent daemon mode",&local_651);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)CONCAT17(in_stack_ffffffffffffebb7,
                   CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
       in_stack_ffffffffffffeba8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_718,"port_file",&local_719);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffebb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_740,"Write port used in persistent daemon mode",&local_741);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)CONCAT17(in_stack_ffffffffffffebb7,
                   CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
       in_stack_ffffffffffffeba8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_808,"cache",&local_809);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffebb8,
             (bool *)CONCAT17(in_stack_ffffffffffffebb7,
                              CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_830,"c",&local_831);
  VW::config::typed_option<bool>::short_name
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
             in_stack_ffffffffffffeba8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_858,"Use a cache.  The default is <data>.cache",&local_859);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
             in_stack_ffffffffffffeba8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffec00,(typed_option<bool> *)in_stack_ffffffffffffebf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_920,"cache_file",&local_921);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffebb8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffebb7,
                         CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_948,"The location(s) of cache_file.",&local_949);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)CONCAT17(in_stack_ffffffffffffebb7,
                     CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
         in_stack_ffffffffffffeba8);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            (in_stack_ffffffffffffec00,
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffebf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a10,"json",&local_a11);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffebb8,
             (bool *)CONCAT17(in_stack_ffffffffffffebb7,
                              CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a38,"Enable JSON parsing.",&local_a39);
  this = (options_boost_po *)
         VW::config::typed_option<bool>::help
                   ((typed_option<bool> *)
                    CONCAT17(in_stack_ffffffffffffebb7,
                             CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
                    in_stack_ffffffffffffeba8);
  key = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                  (in_stack_ffffffffffffec00,(typed_option<bool> *)in_stack_ffffffffffffebf8);
  token = (string *)local_b01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_b01 + 1),"dsjson",(allocator *)token);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffebb8,
             (bool *)CONCAT17(in_stack_ffffffffffffebb7,
                              CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  paVar4 = &local_b29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b28,"Enable Decision Service JSON parsing.",paVar4);
  iVar6 = (int)((ulong)paVar4 >> 0x20);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
             in_stack_ffffffffffffeba8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffec00,(typed_option<bool> *)in_stack_ffffffffffffebf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bf0,"kill_cache",&local_bf1);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffebb8,
             (bool *)CONCAT17(in_stack_ffffffffffffebb7,
                              CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c18,"k",&local_c19);
  VW::config::typed_option<bool>::short_name
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
             in_stack_ffffffffffffeba8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c40,"do not reuse existing cache: create a new one always",&local_c41);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
             in_stack_ffffffffffffeba8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffec00,(typed_option<bool> *)in_stack_ffffffffffffebf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d08,"compressed",&local_d09);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffebb8,
             (bool *)CONCAT17(in_stack_ffffffffffffebb7,
                              CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d30,
             "use gzip format whenever possible. If a cache file is being created, this option creates a compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."
             ,&local_d31);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
             in_stack_ffffffffffffeba8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffec00,(typed_option<bool> *)in_stack_ffffffffffffebf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_df8,"no_stdin",&local_df9);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffebb8,
             (bool *)CONCAT17(in_stack_ffffffffffffebb7,
                              CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e20,"do not default to reading from stdin",&local_e21);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
             in_stack_ffffffffffffeba8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffec00,(typed_option<bool> *)in_stack_ffffffffffffebf8);
  std::__cxx11::string::~string(local_e20);
  std::allocator<char>::~allocator((allocator<char> *)&local_e21);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::__cxx11::string::~string(local_df8);
  std::allocator<char>::~allocator((allocator<char> *)&local_df9);
  std::__cxx11::string::~string(local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::__cxx11::string::~string(local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  std::__cxx11::string::~string(local_c40);
  std::allocator<char>::~allocator((allocator<char> *)&local_c41);
  std::__cxx11::string::~string(local_c18);
  std::allocator<char>::~allocator((allocator<char> *)&local_c19);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::__cxx11::string::~string(local_bf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
  std::__cxx11::string::~string(local_b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_b29);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::__cxx11::string::~string((string *)(local_b01 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b01);
  std::__cxx11::string::~string(local_a38);
  std::allocator<char>::~allocator((allocator<char> *)&local_a39);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::__cxx11::string::~string(local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  std::__cxx11::string::~string(local_948);
  std::allocator<char>::~allocator((allocator<char> *)&local_949);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffebb7,
                              CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::__cxx11::string::~string(local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  std::__cxx11::string::~string(local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  std::__cxx11::string::~string(local_830);
  std::allocator<char>::~allocator((allocator<char> *)&local_831);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::__cxx11::string::~string(local_808);
  std::allocator<char>::~allocator((allocator<char> *)&local_809);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT17(in_stack_ffffffffffffebb7,
                            CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::__cxx11::string::~string(local_650);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT17(in_stack_ffffffffffffebb7,
                            CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::__cxx11::string::~string(local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffebb7,
                      CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT17(in_stack_ffffffffffffebb7,
                            CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)));
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  (**(code **)*local_18)(local_18,local_58);
  local_e30 = local_18;
  if (local_18 == (long *)0x0) {
    local_1378 = 0;
  }
  else {
    local_1378 = __dynamic_cast(local_18,&VW::config::options_i::typeinfo,
                                &VW::config::options_boost_po::typeinfo,0);
  }
  local_e38 = local_1378;
  if (local_1378 != 0) {
    std::__cxx11::string::string(local_e58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e78,"data",&local_e79);
    bVar1 = VW::config::options_boost_po::try_get_positional_option_token
                      (this,&key->m_name,token,iVar6);
    std::__cxx11::string::~string(local_e78);
    std::allocator<char>::~allocator((allocator<char> *)&local_e79);
    if ((bVar1) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffebb7,
                                          CONCAT16(in_stack_ffffffffffffebb6,
                                                   in_stack_ffffffffffffebb0)),
                                in_stack_ffffffffffffeba8), bVar1)) {
      std::__cxx11::string::operator=((string *)(local_10 + 0x60),local_e58);
    }
    std::__cxx11::string::~string(local_e58);
  }
  plVar5 = local_18;
  local_ea2 = 0;
  local_ea3 = 0;
  local_eca = 0;
  local_ecb = 0;
  local_138a = 1;
  if ((in_RDI->daemon & 1U) == 0) {
    std::allocator<char>::allocator();
    local_ea2 = 1;
    std::__cxx11::string::string(local_ea0,"pid_file",&local_ea1);
    local_ea3 = 1;
    bVar2 = (**(code **)(*plVar5 + 8))(plVar5,local_ea0);
    plVar5 = local_18;
    local_138a = 1;
    if ((bVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      local_eca = 1;
      std::__cxx11::string::string(local_ec8,"port",&local_ec9);
      local_ecb = 1;
      bVar2 = (**(code **)(*plVar5 + 8))(plVar5,local_ec8);
      local_13ba = 0;
      if ((bVar2 & 1) != 0) {
        local_13ba = *(byte *)(local_10 + 0x343b) ^ 0xff;
      }
      local_138a = local_13ba;
    }
  }
  if ((local_ecb & 1) != 0) {
    std::__cxx11::string::~string(local_ec8);
  }
  if ((local_eca & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_ec9);
  }
  if ((local_ea3 & 1) != 0) {
    std::__cxx11::string::~string(local_ea0);
  }
  if ((local_ea2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_ea1);
  }
  if ((local_138a & 1) != 0) {
    *(undefined1 *)(local_10 + 0x80) = 1;
    *(undefined8 *)(local_10 + 0x348) = 100000;
  }
  if ((in_RDI->cache & 1U) != 0) {
    std::operator+(in_stack_ffffffffffffebd8,(char *)in_stack_ffffffffffffebd0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_ffffffffffffebb7,
                            CONCAT16(in_stack_ffffffffffffebb6,in_stack_ffffffffffffebb0)),
                in_stack_ffffffffffffeba8);
    std::__cxx11::string::~string(local_ef0);
  }
  if ((in_RDI->compressed & 1U) != 0) {
    set_compressed(in_stack_ffffffffffffebd0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f10,".gz",&local_f11);
  bVar1 = ends_with((string *)
                    CONCAT17(in_stack_ffffffffffffebcf,
                             CONCAT16(in_stack_ffffffffffffebce,in_stack_ffffffffffffebc8)),
                    in_stack_ffffffffffffebc0);
  std::__cxx11::string::~string(local_f10);
  std::allocator<char>::~allocator((allocator<char> *)&local_f11);
  if (bVar1) {
    set_compressed(in_stack_ffffffffffffebd0);
  }
  plVar5 = local_18;
  iVar6 = (int)((ulong)in_stack_ffffffffffffebd0 >> 0x20);
  local_f3a = 0;
  local_f3b = 0;
  local_f62 = 0;
  local_f63 = 0;
  if ((in_RDI->cache & 1U) == 0) {
    std::allocator<char>::allocator();
    local_f3a = 1;
    std::__cxx11::string::string(local_f38,"cache_file",&local_f39);
    local_f3b = 1;
    bVar2 = (**(code **)(*plVar5 + 8))(plVar5,local_f38);
    local_13f2 = 0;
    if ((bVar2 & 1) == 0) goto LAB_00126e0d;
  }
  paVar4 = &local_f61;
  plVar5 = local_18;
  std::allocator<char>::allocator();
  local_f62 = 1;
  std::__cxx11::string::string(local_f60,"invert_hash",paVar4);
  local_f63 = 1;
  local_13f2 = (**(code **)(*plVar5 + 8))(plVar5,local_f60);
LAB_00126e0d:
  if ((local_f63 & 1) != 0) {
    std::__cxx11::string::~string(local_f60);
  }
  if ((local_f62 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_f61);
  }
  if ((local_f3b & 1) != 0) {
    std::__cxx11::string::~string(local_f38);
  }
  if ((local_f3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_f39);
  }
  if ((local_13f2 & 1) == 0) {
    local_113a = 0;
    local_113b = 0;
    bVar1 = false;
    bVar2 = 0;
    if ((*(byte *)(local_10 + 0x3457) & 1) == 0) {
      paVar4 = &local_1139;
      plVar5 = local_18;
      std::allocator<char>::allocator();
      local_113a = 1;
      std::__cxx11::string::string(local_1138,"output_feature_regularizer_binary",paVar4);
      local_113b = 1;
      bVar2 = (**(code **)(*plVar5 + 8))(plVar5,local_1138);
      bVar1 = (bVar2 & 1) == 0;
      bVar2 = 1;
      if (bVar1) {
        paVar4 = &local_1161;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1160,"output_feature_regularizer_text",paVar4);
        in_stack_ffffffffffffebb7 = (**(code **)(*local_18 + 8))(local_18,local_1160);
        bVar2 = in_stack_ffffffffffffebb7;
      }
    }
    if (bVar1) {
      std::__cxx11::string::~string(local_1160);
      std::allocator<char>::~allocator((allocator<char> *)&local_1161);
    }
    if ((local_113b & 1) != 0) {
      std::__cxx11::string::~string(local_1138);
    }
    if ((local_113a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_1139);
    }
    if ((bVar2 & 1) != 0) {
      *(undefined1 *)(local_10 + 0x3457) = 1;
      this_00 = std::operator<<((ostream *)(local_10 + 0xe0),
                                "Making holdout_set_off=true since output regularizer specified");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    local_19 = 1;
    VW::config::option_group_definition::~option_group_definition
              ((option_group_definition *)
               CONCAT17(in_stack_ffffffffffffebb7,CONCAT16(bVar2,in_stack_ffffffffffffebb0)));
    if ((local_19 & 1) == 0) {
      ::input_options::~input_options
                ((input_options *)
                 CONCAT17(in_stack_ffffffffffffebb7,CONCAT16(bVar2,in_stack_ffffffffffffebb0)));
    }
    return in_RDI;
  }
  std::__cxx11::stringstream::stringstream(local_10f0);
  std::operator<<(&local_10e0,
                  "invert_hash is incompatible with a cache file.  Use it in single pass mode only."
                 );
  local_1111 = 1;
  uVar3 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            ((vw_exception *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0),
             (char *)in_stack_ffffffffffffebd8,iVar6,
             (string *)
             CONCAT17(in_stack_ffffffffffffebcf,
                      CONCAT16(in_stack_ffffffffffffebce,in_stack_ffffffffffffebc8)));
  local_1111 = 0;
  __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

input_options parse_source(vw& all, options_i& options)
{
  input_options parsed_options;

  option_group_definition input_options("Input options");
  input_options.add(make_option("data", all.data_filename).short_name("d").help("Example set"))
      .add(make_option("daemon", parsed_options.daemon).help("persistent daemon mode on port 26542"))
      .add(make_option("foreground", parsed_options.foreground)
               .help("in persistent daemon mode, do not run in the background"))
      .add(make_option("port", parsed_options.port).help("port to listen on; use 0 to pick unused port"))
      .add(make_option("num_children", all.num_children).help("number of children for persistent daemon mode"))
      .add(make_option("pid_file", parsed_options.pid_file).help("Write pid file in persistent daemon mode"))
      .add(make_option("port_file", parsed_options.port_file).help("Write port used in persistent daemon mode"))
      .add(make_option("cache", parsed_options.cache).short_name("c").help("Use a cache.  The default is <data>.cache"))
      .add(make_option("cache_file", parsed_options.cache_files).help("The location(s) of cache_file."))
      .add(make_option("json", parsed_options.json).help("Enable JSON parsing."))
      .add(make_option("dsjson", parsed_options.dsjson).help("Enable Decision Service JSON parsing."))
      .add(make_option("kill_cache", parsed_options.kill_cache)
               .short_name("k")
               .help("do not reuse existing cache: create a new one always"))
      .add(
          make_option("compressed", parsed_options.compressed)
              .help(
                  "use gzip format whenever possible. If a cache file is being created, this option creates a "
                  "compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."))
      .add(make_option("no_stdin", all.stdin_off).help("do not default to reading from stdin"));

  options.add_and_parse(input_options);

  // If the option provider is program_options try and retrieve data as a positional parameter.
  options_i* options_ptr = &options;
  auto boost_options = dynamic_cast<options_boost_po*>(options_ptr);
  if (boost_options)
  {
    std::string data;
    if (boost_options->try_get_positional_option_token("data", data, -1))
    {
      if (all.data_filename != data)
      {
        all.data_filename = data;
      }
    }
  }

  if (parsed_options.daemon || options.was_supplied("pid_file") || (options.was_supplied("port") && !all.active))
  {
    all.daemon = true;
    // allow each child to process up to 1e5 connections
    all.numpasses = (size_t)1e5;
  }

  // Add an implicit cache file based on the data filename.
  if (parsed_options.cache)
  {
    parsed_options.cache_files.push_back(all.data_filename + ".cache");
  }

  if (parsed_options.compressed)
    set_compressed(all.p);

  if (ends_with(all.data_filename, ".gz"))
    set_compressed(all.p);

  if ((parsed_options.cache || options.was_supplied("cache_file")) && options.was_supplied("invert_hash"))
    THROW("invert_hash is incompatible with a cache file.  Use it in single pass mode only.");

  if (!all.holdout_set_off &&
      (options.was_supplied("output_feature_regularizer_binary") ||
          options.was_supplied("output_feature_regularizer_text")))
  {
    all.holdout_set_off = true;
    all.trace_message << "Making holdout_set_off=true since output regularizer specified" << endl;
  }

  return parsed_options;
}